

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Fire_PDU::Fire_PDU
          (Fire_PDU *this,Warfare_Header *WarfareHeader,KUINT32 FireMissionIndex,
          WorldCoordinates *Location,DescPtr *Desc,Vector *Velocity,KFLOAT32 Range)

{
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_68;
  KFLOAT32 local_3c;
  Vector *pVStack_38;
  KFLOAT32 Range_local;
  Vector *Velocity_local;
  DescPtr *Desc_local;
  WorldCoordinates *Location_local;
  Warfare_Header *pWStack_18;
  KUINT32 FireMissionIndex_local;
  Warfare_Header *WarfareHeader_local;
  Fire_PDU *this_local;
  
  local_3c = Range;
  pVStack_38 = Velocity;
  Velocity_local = (Vector *)Desc;
  Desc_local = (DescPtr *)Location;
  Location_local._4_4_ = FireMissionIndex;
  pWStack_18 = WarfareHeader;
  WarfareHeader_local = &this->super_Warfare_Header;
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header,WarfareHeader);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_0032fd08;
  this->m_ui32FireMissionIndex = Location_local._4_4_;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Location,(WorldCoordinates *)Desc_local);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_Velocity,pVStack_38);
  this->m_f32Range = local_3c;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x02';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x60;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_68,Desc);
  SetDescriptor(this,&local_68);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_68);
  return;
}

Assistant:

Fire_PDU::Fire_PDU( const Warfare_Header & WarfareHeader, KUINT32 FireMissionIndex, const WorldCoordinates & Location,
                    DescPtr Desc, const Vector & Velocity, KFLOAT32 Range ) :
    Warfare_Header( WarfareHeader ),
    m_ui32FireMissionIndex( FireMissionIndex ),
    m_Location( Location ),
    m_Velocity( Velocity ),
    m_f32Range( Range )
{
    m_ui8PDUType = Fire_PDU_Type;
    m_ui16PDULength = FIRE_PDU_SIZE;
    SetDescriptor( Desc );
}